

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void apx_build_command_with_ptr
               (apx_command_t *self,apx_cmdType_t cmd_type,uint32_t d1,uint32_t d2,void *d3,void *d4
               )

{
  if (self != (apx_command_t *)0x0) {
    self->cmd_type = cmd_type;
    self->data1 = d1;
    self->data2 = d2;
    (self->data3).ptr = d3;
    self->data4 = d4;
  }
  return;
}

Assistant:

void apx_build_command_with_ptr(apx_command_t* self, apx_cmdType_t cmd_type, uint32_t d1, uint32_t d2, void* d3, void* d4)
{
   if (self != NULL)
   {
      self->cmd_type = cmd_type;
      self->data1 = d1;
      self->data2 = d2;
      self->data3.ptr = d3;
      self->data4 = d4;
   }
}